

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.hpp
# Opt level: O0

size_t __thiscall FileAndMemReader::tell(FileAndMemReader *this)

{
  bool bVar1;
  FileAndMemReader *this_local;
  
  bVar1 = isValid(this);
  if (bVar1) {
    if (this->m_fp == (FILE *)0x0) {
      this_local = (FileAndMemReader *)this->m_mp_tell;
    }
    else {
      this_local = (FileAndMemReader *)ftell((FILE *)this->m_fp);
    }
  }
  else {
    this_local = (FileAndMemReader *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t tell()
    {
        if(!this->isValid())
            return 0;
        if(m_fp)//If a file
            return static_cast<size_t>(std::ftell(m_fp));
        else//If a memory block
            return m_mp_tell;
    }